

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzintrulet3d.cpp
# Opt level: O3

void __thiscall
TPZIntRuleT3D::TransformBarycentricCoordInCartesianCoord
          (TPZIntRuleT3D *this,longdouble *baryvec,longdouble *weightvec)

{
  int iVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  long lVar6;
  
  iVar1 = this->fNumInt;
  if (0 < (long)iVar1) {
    plVar2 = (this->fWeight).super_TPZVec<long_double>.fStore;
    plVar3 = (this->fLocationKsi).super_TPZVec<long_double>.fStore;
    plVar4 = (this->fLocationEta).super_TPZVec<long_double>.fStore;
    plVar5 = (this->fLocationZeta).super_TPZVec<long_double>.fStore;
    lVar6 = 0;
    do {
      *(unkbyte10 *)((long)plVar2 + lVar6) = *(unkbyte10 *)((long)weightvec + lVar6);
      *(unkbyte10 *)((long)plVar3 + lVar6) = *(unkbyte10 *)((long)baryvec + lVar6 * 4 + 0x10);
      *(unkbyte10 *)((long)plVar4 + lVar6) = *(unkbyte10 *)((long)baryvec + lVar6 * 4 + 0x20);
      *(unkbyte10 *)((long)plVar5 + lVar6) = *(unkbyte10 *)((long)baryvec + lVar6 * 4 + 0x30);
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar6);
  }
  return;
}

Assistant:

void TPZIntRuleT3D::TransformBarycentricCoordInCartesianCoord(long double baryvec[],long double weightvec[]) {
	for(int i=0;i<fNumInt;i++) {
		fWeight[i] = weightvec[i];
		fLocationKsi[i] = baryvec[4*i+1];
		fLocationEta[i] = baryvec[4*i+2];
		fLocationZeta[i] = baryvec[4*i+3];
	}
}